

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t driver::zeContextSystemBarrier(ze_context_handle_t hContext,ze_device_handle_t hDevice)

{
  ze_pfnContextSystemBarrier_t pfnSystemBarrier;
  ze_result_t result;
  ze_device_handle_t hDevice_local;
  ze_context_handle_t hContext_local;
  
  pfnSystemBarrier._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c2e8 != (code *)0x0) {
    pfnSystemBarrier._4_4_ = (*DAT_0011c2e8)(hContext,hDevice);
  }
  return pfnSystemBarrier._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeContextSystemBarrier(
        ze_context_handle_t hContext,                   ///< [in] handle of context object
        ze_device_handle_t hDevice                      ///< [in] handle of the device
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnSystemBarrier = context.zeDdiTable.Context.pfnSystemBarrier;
        if( nullptr != pfnSystemBarrier )
        {
            result = pfnSystemBarrier( hContext, hDevice );
        }
        else
        {
            // generic implementation
        }

        return result;
    }